

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UChar32 __thiscall icu_63::UnicodeSet::charAt(UnicodeSet *this,int32_t index)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  UChar32 UVar5;
  int iVar6;
  
  UVar5 = -1;
  if (-1 < index) {
    lVar4 = 0;
    do {
      iVar3 = index;
      if ((long)((long)this->len & 0xfffffffffffffffeU) <= lVar4) {
        return -1;
      }
      iVar1 = this->list[lVar4];
      lVar2 = lVar4 + 1;
      lVar4 = lVar4 + 2;
      iVar6 = this->list[lVar2] - iVar1;
      index = iVar3 - iVar6;
    } while (iVar6 <= iVar3);
    UVar5 = iVar1 + iVar3;
  }
  return UVar5;
}

Assistant:

UChar32 UnicodeSet::charAt(int32_t index) const {
    if (index >= 0) {
        // len2 is the largest even integer <= len, that is, it is len
        // for even values and len-1 for odd values.  With odd values
        // the last entry is UNICODESET_HIGH.
        int32_t len2 = len & ~1;
        for (int32_t i=0; i < len2;) {
            UChar32 start = list[i++];
            int32_t count = list[i++] - start;
            if (index < count) {
                return (UChar32)(start + index);
            }
            index -= count;
        }
    }
    return (UChar32)-1;
}